

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_norm1_block(Integer g_a,void *ptr,Integer *lo,Integer *hi,Integer ld,Integer type,
                     Integer ndim,Integer *dims,void *buf)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  undefined8 in_R9;
  double dVar4;
  long in_stack_00000008;
  double *in_stack_00000018;
  float temp_1;
  SingleComplex cval;
  double temp;
  DoubleComplex zval;
  SingleComplex *csum;
  DoubleComplex *zsum;
  float *fsum;
  double *dsum;
  long *lsum;
  int *isum;
  Integer j;
  Integer i;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  double local_118;
  float local_10c;
  long local_108;
  int local_fc;
  float local_e0;
  float fStack_dc;
  double *local_90;
  double *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_68 = (double *)0x0;
  local_70 = (double *)0x0;
  local_78 = (double *)0x0;
  local_80 = (double *)0x0;
  local_88 = (double *)0x0;
  local_90 = (double *)0x0;
  switch(in_R9) {
  case 0x3e9:
    local_68 = in_stack_00000018;
    break;
  case 0x3ea:
    local_70 = in_stack_00000018;
    break;
  case 0x3eb:
    local_80 = in_stack_00000018;
    break;
  case 0x3ec:
    local_78 = in_stack_00000018;
    break;
  default:
    pnga_error((char *)zsum,(Integer)csum);
    break;
  case 0x3ee:
    local_90 = in_stack_00000018;
    break;
  case 0x3ef:
    local_88 = in_stack_00000018;
  }
  if (in_stack_00000008 < 1) {
    pnga_error((char *)zsum,(Integer)csum);
  }
  else if (in_stack_00000008 == 1) {
    local_38 = *in_RDX;
    local_40 = *in_RCX;
    local_48 = 1;
    local_50 = 1;
  }
  else if (in_stack_00000008 == 2) {
    local_38 = *in_RDX;
    local_40 = *in_RCX;
    local_48 = in_RDX[1];
    local_50 = in_RCX[1];
  }
  else {
    pnga_error((char *)zsum,(Integer)csum);
  }
  if ((0 < local_40) && (0 < local_50)) {
    switch(in_R9) {
    case 0x3e9:
      *(float *)local_68 = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          if (*(int *)(in_RSI + (local_60 * in_R8 + local_58) * 4) < 0) {
            local_fc = -*(int *)(in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          else {
            local_fc = *(int *)(in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          *(int *)local_68 = local_fc + (int)*(float *)local_68;
        }
      }
      break;
    case 0x3ea:
      *local_70 = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          if (*(long *)(in_RSI + (local_60 * in_R8 + local_58) * 8) < 0) {
            local_108 = -*(long *)(in_RSI + (local_60 * in_R8 + local_58) * 8);
          }
          else {
            local_108 = *(long *)(in_RSI + (local_60 * in_R8 + local_58) * 8);
          }
          *local_70 = (double)(local_108 + (long)*local_70);
        }
      }
      break;
    case 0x3eb:
      *(float *)local_80 = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          if (*(float *)(in_RSI + (local_60 * in_R8 + local_58) * 4) < 0.0) {
            local_10c = -*(float *)(in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          else {
            local_10c = *(float *)(in_RSI + (local_60 * in_R8 + local_58) * 4);
          }
          *(float *)local_80 = local_10c + *(float *)local_80;
        }
      }
      break;
    case 0x3ec:
      *local_78 = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          if (*(double *)(in_RSI + (local_60 * in_R8 + local_58) * 8) < 0.0) {
            local_118 = -*(double *)(in_RSI + (local_60 * in_R8 + local_58) * 8);
          }
          else {
            local_118 = *(double *)(in_RSI + (local_60 * in_R8 + local_58) * 8);
          }
          *local_78 = local_118 + *local_78;
        }
      }
      break;
    default:
      pnga_error((char *)zsum,(Integer)csum);
      break;
    case 0x3ee:
      *(float *)local_90 = 0.0;
      *(float *)((long)local_90 + 4) = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          uVar2 = *(undefined8 *)(in_RSI + (local_60 * in_R8 + local_58) * 8);
          local_e0 = (float)uVar2;
          fStack_dc = (float)((ulong)uVar2 >> 0x20);
          dVar4 = sqrt((double)(local_e0 * local_e0 + fStack_dc * fStack_dc));
          *(float *)local_90 = (float)dVar4 + *(float *)local_90;
        }
      }
      break;
    case 0x3ef:
      *local_88 = 0.0;
      local_88[1] = 0.0;
      for (local_58 = 0; local_58 < (local_40 - local_38) + 1; local_58 = local_58 + 1) {
        for (local_60 = 0; local_60 < (local_50 - local_48) + 1; local_60 = local_60 + 1) {
          pdVar3 = (double *)(in_RSI + (local_60 * in_R8 + local_58) * 0x10);
          dVar4 = *pdVar3;
          dVar1 = pdVar3[1];
          dVar4 = sqrt(dVar4 * dVar4 + dVar1 * dVar1);
          *local_88 = dVar4 + *local_88;
        }
      }
    }
  }
  return;
}

Assistant:

static void sgai_norm1_block(Integer g_a, void *ptr,
                     Integer *lo, Integer *hi, Integer ld,
                     Integer type,
                     Integer ndim, Integer *dims, void *buf)
{
  Integer iloA=0, ihiA=0, jloA=0, jhiA=0;
  Integer i, j;
  int *isum = NULL;
  long *lsum = NULL;
  double *dsum = NULL;
  float *fsum = NULL;
  DoubleComplex *zsum = NULL;
  SingleComplex *csum = NULL;

  switch (type)
  {
    case C_INT:
      isum = (int *) buf;
      break;
    case C_LONG:
      lsum = (long *) buf;
      break;
    case C_FLOAT:
      fsum = (float *) buf;
      break;
    case C_DBL:
      dsum = (double *) buf;
      break;
    case C_DCPL:
      zsum = (DoubleComplex *) buf;
      break;
    case C_SCPL:
      csum = (SingleComplex *) buf;
      break;
    default:
      pnga_error("ga1_norm1_block: wrong data type:", type);
  }

  if(ndim<=0)
    pnga_error("sgai_norm1_block: wrong dimension", ndim);
  else if(ndim == 1) { 
    iloA=lo[0];
    ihiA=hi[0];
    jloA=1;
    jhiA=1;
  }
  else if(ndim == 2)
  {
    iloA=lo[0];
    ihiA=hi[0];
    jloA=lo[1];
    jhiA=hi[1];
  }
  else
    pnga_error("sgai_norm1_block: wrong dimension", ndim);

  /* determine subset of my patch to access */
  if (ihiA > 0 && jhiA > 0)
  {
    switch (type)
    {
      int *pi;
      double *pd;
      long *pl;
      float *pf;
      DoubleComplex *pz;
      SingleComplex *pc;
      case C_INT:
        pi = (int *) ptr;
        *isum = 0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
            *isum += GA_ABS (pi[j * ld + i]);
        break;
      case C_LONG:
        pl = (long *) ptr;
        *lsum = 0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
            *lsum += GA_ABS (pl[j * ld + i]);
        break;
      case C_DCPL:
        pz = (DoubleComplex *) ptr;
        (*zsum).real = 0.0;
        (*zsum).imag = 0.0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
          {
            DoubleComplex zval = pz[j * ld + i];
            double temp =
              sqrt (zval.real * zval.real + zval.imag * zval.imag);
            (*zsum).real += temp;
          }
        break;
      case C_SCPL:
        pc = (SingleComplex *) ptr;
        (*csum).real = 0.0;
        (*csum).imag = 0.0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
          {
            SingleComplex cval = pc[j * ld + i];
            float temp =
              sqrt (cval.real * cval.real + cval.imag * cval.imag);
            (*csum).real += temp;
          }
        break;
      case C_FLOAT:
        pf = (float *) ptr;
        *fsum = 0.0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
            *fsum += GA_ABS (pf[j * ld + i]);
        break;
      case C_DBL:
        pd = (double *) ptr;
        *dsum = 0.0;
        for (i = 0; i < ihiA - iloA + 1; i++)
          for (j = 0; j < jhiA - jloA + 1; j++)
            *dsum += GA_ABS (pd[j * ld + i]);
        break;
      default:
        pnga_error("sgai_norm1_block: wrong data type ", type);
    }
  }
}